

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptLibrary.cpp
# Opt level: O0

bool Js::JavascriptLibrary::InitializeSharedArrayBufferConstructor
               (DynamicObject *sharedArrayBufferConstructor,DeferredTypeHandlerBase *typeHandler,
               DeferredInitializeMode mode)

{
  ScriptContext *this;
  JavascriptLibrary *this_00;
  Var value;
  JavascriptLibrary *pJVar1;
  DynamicObject **ppDVar2;
  PropertyString *value_00;
  JavascriptLibrary *library;
  ScriptContext *scriptContext;
  DeferredInitializeMode mode_local;
  DeferredTypeHandlerBase *typeHandler_local;
  DynamicObject *sharedArrayBufferConstructor_local;
  
  DeferredTypeHandlerBase::Convert(typeHandler,sharedArrayBufferConstructor,mode,4,0);
  this = RecyclableObject::GetScriptContext(&sharedArrayBufferConstructor->super_RecyclableObject);
  this_00 = RecyclableObject::GetLibrary(&sharedArrayBufferConstructor->super_RecyclableObject);
  value = TaggedInt::ToVarUnchecked(1);
  AddMember(this_00,sharedArrayBufferConstructor,0xd1,value,'\x02');
  pJVar1 = ScriptContext::GetLibrary(this);
  ppDVar2 = Memory::WriteBarrierPtr::operator_cast_to_DynamicObject__
                      ((WriteBarrierPtr *)&pJVar1->sharedArrayBufferPrototype);
  AddMember(this_00,sharedArrayBufferConstructor,0x124,*ppDVar2,'\0');
  AddSpeciesAccessorsToLibraryObject
            (this_00,sharedArrayBufferConstructor,
             (FunctionInfo *)SharedArrayBuffer::EntryInfo::GetterSymbolSpecies);
  value_00 = ScriptContext::GetPropertyString(this,0x2cb);
  AddMember(this_00,sharedArrayBufferConstructor,0x106,value_00,'\x02');
  DynamicObject::SetHasNoEnumerableProperties(sharedArrayBufferConstructor,true);
  return true;
}

Assistant:

bool JavascriptLibrary::InitializeSharedArrayBufferConstructor(DynamicObject* sharedArrayBufferConstructor, DeferredTypeHandlerBase * typeHandler, DeferredInitializeMode mode)
    {
        typeHandler->Convert(sharedArrayBufferConstructor, mode, 4);

        ScriptContext* scriptContext = sharedArrayBufferConstructor->GetScriptContext();
        JavascriptLibrary* library = sharedArrayBufferConstructor->GetLibrary();
        library->AddMember(sharedArrayBufferConstructor, PropertyIds::length, TaggedInt::ToVarUnchecked(1), PropertyConfigurable);
        library->AddMember(sharedArrayBufferConstructor, PropertyIds::prototype, scriptContext->GetLibrary()->sharedArrayBufferPrototype, PropertyNone);
        library->AddSpeciesAccessorsToLibraryObject(sharedArrayBufferConstructor, &SharedArrayBuffer::EntryInfo::GetterSymbolSpecies);
        library->AddMember(sharedArrayBufferConstructor, PropertyIds::name, scriptContext->GetPropertyString(PropertyIds::SharedArrayBuffer), PropertyConfigurable);

        sharedArrayBufferConstructor->SetHasNoEnumerableProperties(true);

        return true;
    }